

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

size_t __thiscall
phmap::priv::
raw_hash_set<phmap::priv::NodeHashMapPolicy<std::__cxx11::string,phmap::priv::Tracked<int>>,phmap::priv::StringHashEqT<char>::Hash,phmap::priv::StringHashEqT<char>::Eq,std::allocator<std::pair<std::__cxx11::string_const,phmap::priv::Tracked<int>>>>
::HashElement::operator()
          (HashElement *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
          piecewise_construct_t *param_2,
          tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *param_3,tuple<const_phmap::priv::Tracked<int>_&> *param_4)

{
  Hash *this_00;
  basic_string_view<char,_std::char_traits<char>_> v;
  size_t sVar1;
  phmap_mix<8> local_31;
  tuple<const_phmap::priv::Tracked<int>_&> *local_30;
  tuple<const_phmap::priv::Tracked<int>_&> *param_4_local;
  tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *param_3_local;
  piecewise_construct_t *param_2_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key_local;
  HashElement *this_local;
  
  this_00 = *(Hash **)this;
  local_30 = param_4;
  param_4_local = (tuple<const_phmap::priv::Tracked<int>_&> *)param_3;
  param_3_local =
       (tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        *)param_2;
  param_2_local = (piecewise_construct_t *)key;
  key_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  v = (basic_string_view<char,_std::char_traits<char>_>)
      std::__cxx11::string::operator_cast_to_basic_string_view((string *)key);
  sVar1 = StringHashEqT<char>::Hash::operator()(this_00,v);
  sVar1 = phmap_mix<8>::operator()(&local_31,sVar1);
  return sVar1;
}

Assistant:

size_t operator()(const K& key, Args&&...) const {
#if PHMAP_DISABLE_MIX
            return h(key);
#else
            return phmap_mix<sizeof(size_t)>()(h(key));
#endif
        }